

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiveSession.cpp
# Opt level: O3

void __thiscall FileReceiveSession::on_error(FileReceiveSession *this,Poll *p,int e)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  path local_40;
  
  if ((this->fail).super__Function_base._M_manager != (_Manager_type)0x0) {
    paVar1 = &local_40.m_pathname.field_2;
    pcVar2 = (this->file).m_pathname._M_dataplus._M_p;
    local_40.m_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar2,pcVar2 + (this->file).m_pathname._M_string_length);
    if ((this->fail).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar3 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40.m_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_40.m_pathname._M_dataplus._M_p,
                        local_40.m_pathname.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar3);
    }
    (*(this->fail)._M_invoker)((_Any_data *)&this->fail,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.m_pathname._M_dataplus._M_p,
                      local_40.m_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  Subscriber::on_error(&this->super_Subscriber,p,e);
  return;
}

Assistant:

void FileReceiveSession::on_error(Poll &p, int e) {
  if (this->fail)
    this->fail(file);
  Subscriber::on_error(p, e);
}